

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Deserializer::BP5Deserializer
          (BP5Deserializer *this,bool WriterIsRowMajor,bool ReaderIsRowMajor,bool RandomAccessMode,
          bool FlattenSteps)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  undefined8 *in_RDI;
  byte in_R8B;
  FMContext Tmp;
  BP5Base *in_stack_ffffffffffffff90;
  
  BP5Base::BP5Base(in_stack_ffffffffffffff90);
  *in_RDI = &VTT;
  *(byte *)(in_RDI + 1) = in_SIL & 1;
  *(byte *)((long)in_RDI + 9) = in_DL & 1;
  in_RDI[2] = 0;
  std::
  vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ::vector((vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
            *)0xd012aa);
  in_RDI[6] = 0;
  *(byte *)(in_RDI + 8) = in_CL & 1;
  *(byte *)((long)in_RDI + 0x41) = in_R8B & 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd012d7);
  in_RDI[0xd] = 0xffffffffffffffff;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
                   *)0xd012f2);
  std::
  unordered_map<void_*,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
  ::unordered_map((unordered_map<void_*,_adios2::format::BP5Deserializer::BP5VarRec_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>_>_>
                   *)0xd01308);
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  std::
  vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
  ::vector((vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
            *)0xd01334);
  std::
  vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
  ::vector((vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
            *)0xd0134a);
  std::
  vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
  ::vector((vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
            *)0xd01360);
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  std::mutex::mutex((mutex *)0xd01392);
  uVar1 = create_local_FMcontext();
  set_ignore_default_values_FMcontext(uVar1);
  uVar2 = create_FFSContext_FM(uVar1);
  in_RDI[7] = uVar2;
  free_FMcontext(uVar1);
  return;
}

Assistant:

BP5Deserializer::BP5Deserializer(bool WriterIsRowMajor, bool ReaderIsRowMajor,
                                 bool RandomAccessMode, bool FlattenSteps)
: m_WriterIsRowMajor{WriterIsRowMajor}, m_ReaderIsRowMajor{ReaderIsRowMajor},
  m_RandomAccessMode{RandomAccessMode}, m_FlattenSteps{FlattenSteps}
{
    FMContext Tmp = create_local_FMcontext();
    set_ignore_default_values_FMcontext(Tmp);
    ReaderFFSContext = create_FFSContext_FM(Tmp);
    free_FMcontext(Tmp);
}